

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTLDec(u32 *tag,size_t *len,octet *der,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t l;
  size_t local_30;
  
  sVar1 = derTDec(tag,der,count);
  uVar4 = 0xffffffffffffffff;
  if ((((sVar1 != 0xffffffffffffffff) &&
       (sVar2 = derLDec(&local_30,der + sVar1,count - sVar1), sVar2 != 0xffffffffffffffff)) &&
      (uVar3 = sVar2 + sVar1, uVar3 <= count)) && (uVar4 = uVar3, len != (size_t *)0x0)) {
    *len = local_30;
  }
  return uVar4;
}

Assistant:

size_t derTLDec(u32* tag, size_t* len, const octet der[], size_t count)
{
	size_t t_count;
	size_t l_count;
	size_t l;
	ASSERT(memIsValid(der, count));
	// обработать T
	ASSERT(tag == 0 || memIsDisjoint2(tag, 4, der, count));
	t_count = derTDec(tag, der, count);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// обработать L
	ASSERT(count >= t_count);
	l_count = derLDec(&l, der + t_count, count - t_count);
	if (l_count == SIZE_MAX || t_count + l_count > count)
		return SIZE_MAX;
	if (len)
	{
		ASSERT(memIsDisjoint2(len, O_PER_S, der, count));
		ASSERT(tag == 0 || memIsDisjoint2(len, O_PER_S, tag, 4));
		*len = l;
	}
	// все нормально
	return t_count + l_count;
}